

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

value_t __thiscall
rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::filtration
          (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
           *this,index_t index)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  get_simplex_vertices<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (index,this->dim,
             (index_t)((ulong)((long)(this->dist->rows).
                                     super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->dist->rows).
                                    super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3),this->binomial_coeff,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (this->dim < 0) {
    fVar7 = 0.0;
  }
  else {
    piVar3 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      if (lVar5 != 0) {
        iVar1 = piVar3[lVar5];
        lVar6 = 0;
        fVar8 = fVar7;
        do {
          iVar2 = piVar3[lVar6];
          fVar7 = 0.0;
          if (iVar1 != iVar2) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            if (iVar1 < iVar2) {
              iVar2 = iVar1;
            }
            fVar7 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl
                    .super__Vector_impl_data._M_start[iVar4][iVar2];
          }
          if (fVar7 <= fVar8) {
            fVar7 = fVar8;
          }
          lVar6 = lVar6 + 1;
          fVar8 = fVar7;
        } while (lVar5 != lVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != (ulong)(uint)this->dim + 1);
  }
  return fVar7;
}

Assistant:

value_t filtration(const index_t index) const {
		value_t filtr = 0;
		get_simplex_vertices(index, dim, index_t(dist.size()), binomial_coeff, vertices.begin());

		for (index_t i = 0; i <= dim; ++i)
			for (index_t j = 0; j < i; ++j) { filtr = std::max(filtr, dist(vertices[i], vertices[j])); }
		return filtr;
	}